

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::ConfigLiblistSyntax::setChild
          (ConfigLiblistSyntax *this,size_t index,TokenOrSyntax child)

{
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  undefined4 uVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar8;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar9;
  
  if (index == 0) {
    pvVar9 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar5 = pvVar9->field_0x2;
    NVar6.raw = (pvVar9->numFlags).raw;
    uVar7 = pvVar9->rawLen;
    pIVar3 = pvVar9->info;
    (this->liblist).kind = pvVar9->kind;
    (this->liblist).field_0x2 = uVar5;
    (this->liblist).numFlags = (NumericTokenFlags)NVar6.raw;
    (this->liblist).rawLen = uVar7;
    (this->liblist).info = pIVar3;
  }
  else {
    ppSVar8 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    pSVar1 = *ppSVar8;
    uVar4 = *(undefined4 *)&pSVar1->field_0x4;
    pSVar2 = pSVar1->parent;
    (this->libraries).super_SyntaxListBase.super_SyntaxNode.kind = pSVar1->kind;
    *(undefined4 *)&(this->libraries).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
    (this->libraries).super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
    (this->libraries).super_SyntaxListBase.super_SyntaxNode.previewNode = pSVar1->previewNode;
    (this->libraries).super_SyntaxListBase.childCount = *(size_t *)(pSVar1 + 1);
    pSVar2 = pSVar1[1].previewNode;
    (this->libraries).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr =
         (pointer)pSVar1[1].parent;
    (this->libraries).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
    _M_extent_value = (size_t)pSVar2;
  }
  return;
}

Assistant:

void ConfigLiblistSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: liblist = child.token(); return;
        case 1: libraries = child.node()->as<TokenList>(); return;
        default: SLANG_UNREACHABLE;
    }
}